

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage3DParamsCase::TexSubImage3DParamsCase
          (TexSubImage3DParamsCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int width,int height,int depth,int subX,int subY,int subZ,int subW
          ,int subH,int subD,int imageHeight,int rowLength,int skipImages,int skipRows,
          int skipPixels,int alignment)

{
  TextureFormat local_38;
  int local_30;
  deUint32 local_2c;
  int width_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TexSubImage3DParamsCase *this_local;
  
  local_30 = width;
  local_2c = internalFormat;
  _width_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  local_38 = glu::mapGLInternalFormat(internalFormat);
  Texture3DSpecCase::Texture3DSpecCase
            (&this->super_Texture3DSpecCase,context,name,desc,&local_38,local_30,height,depth,1);
  (this->super_Texture3DSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__TexSubImage3DParamsCase_0328ed00;
  this->m_internalFormat = local_2c;
  this->m_subX = subX;
  this->m_subY = subY;
  this->m_subZ = subZ;
  this->m_subW = subW;
  this->m_subH = subH;
  this->m_subD = subD;
  this->m_imageHeight = imageHeight;
  this->m_rowLength = rowLength;
  this->m_skipImages = skipImages;
  this->m_skipRows = skipRows;
  this->m_skipPixels = skipPixels;
  this->m_alignment = alignment;
  return;
}

Assistant:

TexSubImage3DParamsCase (Context&		context,
							 const char*	name,
							 const char*	desc,
							 deUint32		internalFormat,
							 int			width,
							 int			height,
							 int			depth,
							 int			subX,
							 int			subY,
							 int			subZ,
							 int			subW,
							 int			subH,
							 int			subD,
							 int			imageHeight,
							 int			rowLength,
							 int			skipImages,
							 int			skipRows,
							 int			skipPixels,
							 int			alignment)
		: Texture3DSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), width, height, depth, 1)
		, m_internalFormat	(internalFormat)
		, m_subX			(subX)
		, m_subY			(subY)
		, m_subZ			(subZ)
		, m_subW			(subW)
		, m_subH			(subH)
		, m_subD			(subD)
		, m_imageHeight		(imageHeight)
		, m_rowLength		(rowLength)
		, m_skipImages		(skipImages)
		, m_skipRows		(skipRows)
		, m_skipPixels		(skipPixels)
		, m_alignment		(alignment)
	{
	}